

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

QList<std::pair<QString,_QString>_> * __thiscall
QUrlQuery::queryItems(QUrlQuery *this,ComponentFormattingOptions encoding)

{
  bool bVar1;
  const_iterator o;
  QUrlQueryPrivate *pQVar2;
  undefined4 in_EDX;
  qsizetype in_RSI;
  QList<std::pair<QString,_QString>_> *in_RDI;
  long in_FS_OFFSET;
  QList<std::pair<QString,_QString>_> *result;
  const_iterator end;
  const_iterator it;
  undefined4 in_stack_fffffffffffffee8;
  QFlagsStorage<QUrl::ComponentFormattingOption> in_stack_fffffffffffffeec;
  pair<QString,_QString> *in_stack_fffffffffffffef0;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  QString *in_stack_ffffffffffffff40;
  QUrlQueryPrivate *in_stack_ffffffffffffff48;
  QFlagsStorage<QUrl::ComponentFormattingOption> in_stack_ffffffffffffffc4;
  const_iterator local_18;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_EDX;
  bVar1 = QSharedDataPointer<QUrlQueryPrivate>::operator!
                    ((QSharedDataPointer<QUrlQueryPrivate> *)0x314999);
  if (bVar1) {
    memset(in_RDI,0,0x18);
    QList<std::pair<QString,_QString>_>::QList((QList<std::pair<QString,_QString>_> *)0x3149ba);
  }
  else {
    local_10 = local_c;
    bVar1 = idempotentRecodeToUser((ComponentFormattingOptions)in_stack_fffffffffffffeec.i);
    if (bVar1) {
      QSharedDataPointer<QUrlQueryPrivate>::operator->
                ((QSharedDataPointer<QUrlQueryPrivate> *)0x3149e9);
      QList<std::pair<QString,_QString>_>::QList
                ((QList<std::pair<QString,_QString>_> *)in_stack_fffffffffffffef0,
                 (QList<std::pair<QString,_QString>_> *)
                 CONCAT44(in_stack_fffffffffffffeec.i,in_stack_fffffffffffffee8));
    }
    else {
      (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->d).ptr = (pair<QString,_QString> *)&DAT_aaaaaaaaaaaaaaaa;
      QList<std::pair<QString,_QString>_>::QList((QList<std::pair<QString,_QString>_> *)0x314a2b);
      local_18.i = (pair<QString,_QString> *)&DAT_aaaaaaaaaaaaaaaa;
      QSharedDataPointer<QUrlQueryPrivate>::operator->
                ((QSharedDataPointer<QUrlQueryPrivate> *)0x314a42);
      local_18 = QList<std::pair<QString,_QString>_>::constBegin(in_stack_fffffffffffffef0);
      QSharedDataPointer<QUrlQueryPrivate>::operator->
                ((QSharedDataPointer<QUrlQueryPrivate> *)0x314a70);
      o = QList<std::pair<QString,_QString>_>::constEnd(in_stack_fffffffffffffef0);
      pQVar2 = QSharedDataPointer<QUrlQueryPrivate>::operator->
                         ((QSharedDataPointer<QUrlQueryPrivate> *)0x314a8e);
      QList<std::pair<QString,_QString>_>::size(&pQVar2->itemList);
      QList<std::pair<QString,_QString>_>::reserve
                ((QList<std::pair<QString,_QString>_> *)
                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),in_RSI);
      while (bVar1 = QList<std::pair<QString,_QString>_>::const_iterator::operator!=(&local_18,o),
            bVar1) {
        QSharedDataPointer<QUrlQueryPrivate>::operator->
                  ((QSharedDataPointer<QUrlQueryPrivate> *)0x314aed);
        QList<std::pair<QString,_QString>_>::const_iterator::operator->(&local_18);
        QUrlQueryPrivate::recodeToUser
                  (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                   (ComponentFormattingOptions)in_stack_ffffffffffffffc4.i);
        pQVar2 = QSharedDataPointer<QUrlQueryPrivate>::operator->
                           ((QSharedDataPointer<QUrlQueryPrivate> *)0x314b3e);
        QList<std::pair<QString,_QString>_>::const_iterator::operator->(&local_18);
        QUrlQueryPrivate::recodeToUser
                  (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                   (ComponentFormattingOptions)in_stack_ffffffffffffffc4.i);
        std::make_pair<QString,QString>((QString *)pQVar2,&in_stack_fffffffffffffef0->first);
        QList<std::pair<QString,_QString>_>::operator<<
                  ((QList<std::pair<QString,_QString>_> *)in_stack_fffffffffffffef0,
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffffeec.i,in_stack_fffffffffffffee8));
        std::pair<QString,_QString>::~pair(in_stack_fffffffffffffef0);
        QString::~QString((QString *)0x314bd6);
        QString::~QString((QString *)0x314be3);
        QList<std::pair<QString,_QString>_>::const_iterator::operator++(&local_18);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<std::pair<QString, QString> > QUrlQuery::queryItems(QUrl::ComponentFormattingOptions encoding) const
{
    if (!d)
        return QList<std::pair<QString, QString> >();
    if (idempotentRecodeToUser(encoding))
        return d->itemList;

    QList<std::pair<QString, QString> > result;
    Map::const_iterator it = d->itemList.constBegin();
    Map::const_iterator end = d->itemList.constEnd();
    result.reserve(d->itemList.size());
    for ( ; it != end; ++it)
        result << std::make_pair(d->recodeToUser(it->first, encoding),
                                 d->recodeToUser(it->second, encoding));
    return result;
}